

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

char * rw::strdup_LOC(char *s,uint32 hint,char *here)

{
  size_t sVar1;
  char *__dest;
  size_t sz;
  char *t;
  char *here_local;
  uint32 hint_local;
  char *s_local;
  
  sVar1 = strlen(s);
  __dest = (char *)malloc_LOC(sVar1 + 1,hint,here);
  if (__dest != (char *)0x0) {
    memcpy(__dest,s,sVar1 + 1);
  }
  return __dest;
}

Assistant:

char *strdup_LOC(const char *s, uint32 hint, const char *here) {
	char *t;
	size_t sz = strlen(s)+1;
	t = (char*)malloc_LOC(sz, hint, here);
	if(t)
		memcpy(t, s, sz);
	return t;
}